

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3FkActions(Parse *pParse,Table *pTab,ExprList *pChanges,int regOld,int *aChange,
                     int bChngRowid)

{
  int iVar1;
  Trigger *p;
  Trigger *pAct;
  FKey *pFKey;
  int bChngRowid_local;
  int *aChange_local;
  int regOld_local;
  ExprList *pChanges_local;
  Table *pTab_local;
  Parse *pParse_local;
  
  if ((pParse->db->flags & 0x4000) != 0) {
    for (pAct = (Trigger *)sqlite3FkReferences(pTab); pAct != (Trigger *)0x0;
        pAct = (Trigger *)pAct->pWhen) {
      if (((aChange == (int *)0x0) ||
          (iVar1 = fkParentIsModified(pTab,(FKey *)pAct,aChange,bChngRowid), iVar1 != 0)) &&
         (p = fkActionTrigger(pParse,pTab,(FKey *)pAct,pChanges), p != (Trigger *)0x0)) {
        sqlite3CodeRowTriggerDirect(pParse,p,pTab,regOld,2,0);
      }
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3FkActions(
  Parse *pParse,                  /* Parse context */
  Table *pTab,                    /* Table being updated or deleted from */
  ExprList *pChanges,             /* Change-list for UPDATE, NULL for DELETE */
  int regOld,                     /* Address of array containing old row */
  int *aChange,                   /* Array indicating UPDATEd columns (or 0) */
  int bChngRowid                  /* True if rowid is UPDATEd */
){
  /* If foreign-key support is enabled, iterate through all FKs that 
  ** refer to table pTab. If there is an action associated with the FK 
  ** for this operation (either update or delete), invoke the associated 
  ** trigger sub-program.  */
  if( pParse->db->flags&SQLITE_ForeignKeys ){
    FKey *pFKey;                  /* Iterator variable */
    for(pFKey = sqlite3FkReferences(pTab); pFKey; pFKey=pFKey->pNextTo){
      if( aChange==0 || fkParentIsModified(pTab, pFKey, aChange, bChngRowid) ){
        Trigger *pAct = fkActionTrigger(pParse, pTab, pFKey, pChanges);
        if( pAct ){
          sqlite3CodeRowTriggerDirect(pParse, pAct, pTab, regOld, OE_Abort, 0);
        }
      }
    }
  }
}